

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O2

zip_source_t * open_file(char *fname)

{
  char *pcVar1;
  FILE *__stream;
  zip_source_t *pzVar2;
  undefined8 uVar3;
  zip_error_t error;
  
  zip_error_init(&error);
  pzVar2 = (zip_source_t *)zip_source_file_create(fname,0,0,&error);
  __stream = _stderr;
  pcVar1 = progname;
  if (pzVar2 != (zip_source_t *)0x0) {
    return pzVar2;
  }
  uVar3 = zip_error_strerror(&error);
  fprintf(__stream,"%s: can\'t open file %s: %s\n",pcVar1,fname,uVar3);
  zip_error_fini(&error);
  exit(1);
}

Assistant:

static zip_source_t *
open_file(const char *fname) {
    zip_error_t error;
    zip_source_t *src;

    zip_error_init(&error);

    if ((src = zip_source_file_create(fname, 0, 0, &error)) == NULL) {
	fprintf(stderr, "%s: can't open file %s: %s\n", progname, fname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    return src;
}